

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<16U,_float>_>::tsvq_node>::push_back
          (vector<basisu::tree_vector_quant<basisu::vec<16U,_float>_>::tsvq_node> *this,
          tsvq_node *obj)

{
  uint uVar1;
  uint uVar2;
  tsvq_node *ptVar3;
  tsvq_node *ptVar4;
  uint *__dest;
  uint *__src;
  uint64_t uVar5;
  undefined4 uVar6;
  int32_t iVar7;
  uint32_t i;
  long lVar8;
  
  ptVar3 = this->m_p;
  if ((ptVar3 <= obj && ptVar3 != (tsvq_node *)0x0) && (obj < ptVar3 + this->m_size)) {
    __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x267,
                  "void basisu::vector<basisu::tree_vector_quant<basisu::vec<16, float>>::tsvq_node>::push_back(const T &) [T = basisu::tree_vector_quant<basisu::vec<16, float>>::tsvq_node]"
                 );
  }
  if (this->m_capacity <= this->m_size) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,this->m_size + 1,true,0x70,object_mover,false);
  }
  ptVar4 = this->m_p;
  uVar1 = this->m_size;
  uVar6 = *(undefined4 *)&obj->field_0x4;
  uVar5 = obj->m_weight;
  ptVar3 = ptVar4 + uVar1;
  ptVar3->m_var = obj->m_var;
  *(undefined4 *)&ptVar3->field_0x4 = uVar6;
  ptVar3->m_weight = uVar5;
  lVar8 = 0;
  do {
    ptVar4[uVar1].m_origin.m_v[lVar8] = (obj->m_origin).m_v[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x10);
  iVar7 = obj->m_right_index;
  ptVar4[uVar1].m_left_index = obj->m_left_index;
  ptVar4[uVar1].m_right_index = iVar7;
  ptVar4[uVar1].m_training_vecs.m_p = (uint *)0x0;
  ptVar4[uVar1].m_training_vecs.m_size = 0;
  ptVar4[uVar1].m_training_vecs.m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&ptVar4[uVar1].m_training_vecs,(obj->m_training_vecs).m_size,false,
             4,(object_mover)0x0,false);
  uVar2 = (obj->m_training_vecs).m_size;
  ptVar4[uVar1].m_training_vecs.m_size = uVar2;
  __dest = ptVar4[uVar1].m_training_vecs.m_p;
  if ((__dest != (uint *)0x0) && (__src = (obj->m_training_vecs).m_p, __src != (uint *)0x0)) {
    memcpy(__dest,__src,(ulong)uVar2 << 2);
  }
  ptVar4[uVar1].m_codebook_index = obj->m_codebook_index;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }